

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyRoomListView.cpp
# Opt level: O2

void __thiscall EmptyRoomListView::display(EmptyRoomListView *this)

{
  Room *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  Controller *this_00;
  View *pVVar4;
  Room *room;
  Room *this_01;
  allocator local_51;
  string local_50;
  
  getParams(this);
  iVar2 = (*(this->super_ListView<Room>).super_MultipleObjectMixin<Room>.super_Model<Room>.
            _vptr_Model[2])(this);
  pRVar1 = (Room *)((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
  for (this_01 = *(Room **)CONCAT44(extraout_var,iVar2); this_01 != pRVar1; this_01 = this_01 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Room #");
    iVar2 = Room::getRoomNumber(this_01);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,", ID: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this_01->super_Model<Room>).id);
    std::operator<<(poVar3,"\n");
  }
  this_00 = Controller::getInstance();
  std::__cxx11::string::string((string *)&local_50,"faculty-panel",&local_51);
  pVVar4 = Controller::getView(this_00,&local_50);
  View::response->view = pVVar4;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void EmptyRoomListView::display() {
    getParams();
    for (auto &room : getQueryset()) {
        cout << "Room #" << room.getRoomNumber() << ", ID: " << room.getId() << "\n";
    }
    response->view = Controller::getInstance().getView("faculty-panel");
}